

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  uint characteristic;
  lazy_ostream *plVar3;
  undefined4 local_ea0;
  Dimension local_e9c;
  basic_cstring<const_char> local_e98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e88;
  basic_cstring<const_char> local_e60;
  basic_cstring<const_char> local_e50;
  undefined4 local_e40;
  Dimension local_e3c;
  basic_cstring<const_char> local_e38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e28;
  basic_cstring<const_char> local_e00;
  basic_cstring<const_char> local_df0;
  undefined4 local_de0;
  Index local_ddc;
  basic_cstring<const_char> local_dd8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_dc8;
  basic_cstring<const_char> local_da0;
  basic_cstring<const_char> local_d90;
  undefined4 local_d80;
  Index local_d7c;
  basic_cstring<const_char> local_d78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d68;
  basic_cstring<const_char> local_d40;
  basic_cstring<const_char> local_d30;
  undefined4 local_d20;
  Index local_d1c;
  basic_cstring<const_char> local_d18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d08;
  basic_cstring<const_char> local_ce0;
  basic_cstring<const_char> local_cd0;
  undefined4 local_cc0;
  Dimension local_cbc;
  basic_cstring<const_char> local_cb8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ca8;
  basic_cstring<const_char> local_c80;
  basic_cstring<const_char> local_c70;
  undefined4 local_c60;
  Dimension local_c5c;
  basic_cstring<const_char> local_c58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c48;
  basic_cstring<const_char> local_c20;
  basic_cstring<const_char> local_c10;
  undefined4 local_c00;
  Index local_bfc;
  basic_cstring<const_char> local_bf8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_be8;
  basic_cstring<const_char> local_bc0;
  basic_cstring<const_char> local_bb0;
  undefined1 local_ba0 [8];
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mm;
  basic_cstring<const_char> local_a80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a70;
  basic_cstring<const_char> local_a48;
  basic_cstring<const_char> local_a38;
  undefined4 local_a28;
  Dimension local_a24;
  basic_cstring<const_char> local_a20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a10;
  basic_cstring<const_char> local_9e8;
  basic_cstring<const_char> local_9d8;
  undefined4 local_9c8;
  Index local_9c4;
  basic_cstring<const_char> local_9c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_9b0;
  basic_cstring<const_char> local_988;
  basic_cstring<const_char> local_978;
  undefined4 local_968;
  Dimension local_964;
  basic_cstring<const_char> local_960;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_950;
  basic_cstring<const_char> local_928;
  basic_cstring<const_char> local_918;
  undefined4 local_908;
  Dimension local_904;
  basic_cstring<const_char> local_900;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_8f0;
  basic_cstring<const_char> local_8c8;
  basic_cstring<const_char> local_8b8;
  undefined4 local_8a8;
  Index local_8a4;
  basic_cstring<const_char> local_8a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_890;
  basic_cstring<const_char> local_868;
  basic_cstring<const_char> local_858;
  undefined1 local_848 [8];
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mc2;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mc1;
  basic_cstring<const_char> local_610;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_600;
  basic_cstring<const_char> local_5d8;
  basic_cstring<const_char> local_5c8;
  function<bool_(unsigned_int,_unsigned_int)> local_5b8;
  function<bool_(unsigned_int,_unsigned_int)> local_598;
  undefined1 local_578 [8];
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mr;
  basic_cstring<const_char> local_458;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_448;
  basic_cstring<const_char> local_420;
  basic_cstring<const_char> local_410;
  undefined4 local_400;
  Dimension local_3fc;
  basic_cstring<const_char> local_3f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3e8;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  undefined4 local_3a0;
  Index local_39c;
  basic_cstring<const_char> local_398;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_388;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  function<bool_(unsigned_int,_unsigned_int)> local_340;
  function<bool_(unsigned_int,_unsigned_int)> local_320;
  undefined1 local_300 [8];
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mb;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198 [2];
  function<bool_(unsigned_int,_unsigned_int)> local_178;
  function<bool_(unsigned_int,_unsigned_int)> local_158;
  undefined1 local_138 [8];
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
            ();
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_158,birth_comp);
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_178,death_comp);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)local_138,&local_158,&local_178);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_178);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_158);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_198,0x15f,&local_1a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d0,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    mb.matrix_.colSettings_._4_4_ =
         Gudhi::persistence_matrix::
         Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
         ::get_number_of_columns
                   ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                     *)local_138);
    mb.matrix_.colSettings_._0_4_ = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_1d0,&local_1e0,0x15f,1,2,(undefined1 *)((long)&mb.matrix_.colSettings_ + 4),
               "m.get_number_of_columns()",&mb.matrix_.colSettings_,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_320,birth_comp);
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_340,death_comp);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>
              *)local_300,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,&local_320,&local_340,5);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_340);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_320);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_360);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_350,0x163,&local_360);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_388,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_39c = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_300);
    local_3a0 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_388,&local_398,0x163,1,2,&local_39c,"mb.get_number_of_columns()",&local_3a0,
               "7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_388);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0x164,&local_3c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3e8,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_3fc = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_300,2);
    local_400 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_3e8,&local_3f8,0x164,1,2,&local_3fc,"mb.get_column_dimension(2)",&local_400,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_420);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_410,0x165,&local_420);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_448,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_458,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    mr.matrix_.colSettings_._4_4_ =
         Gudhi::persistence_matrix::
         Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
         ::get_column_dimension
                   ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                     *)local_300,6);
    mr.matrix_.colSettings_._0_4_ = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_448,&local_458,0x165,1,2,(undefined1 *)((long)&mr.matrix_.colSettings_ + 4),
               "mb.get_column_dimension(6)",&mr.matrix_.colSettings_,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_448);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_598,birth_comp);
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_5b8,death_comp);
  characteristic =
       Gudhi::persistence_matrix::
       Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
       ::get_null_value<unsigned_int>();
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)local_578,5,&local_598,&local_5b8,characteristic);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_5b8);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_598);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5c8,0x169,&local_5d8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_600,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    mc1.matrix_.colSettings_._4_4_ =
         Gudhi::persistence_matrix::
         Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
         ::get_number_of_columns
                   ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                     *)local_578);
    mc1.matrix_.colSettings_._0_4_ = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_600,&local_610,0x169,1,2,(undefined1 *)((long)&mc1.matrix_.colSettings_ + 4),
               "mr.get_number_of_columns()",&mc1.matrix_.colSettings_,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_600);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)&mc2.matrix_.colSettings_,
           (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)local_300);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)local_848,
           (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)local_300);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_858,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_868);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_858,0x16e,&local_868);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_890,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_8a4 = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)&mc2.matrix_.colSettings_);
    local_8a8 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_890,&local_8a0,0x16e,1,2,&local_8a4,"mc1.get_number_of_columns()",&local_8a8,
               "7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_890);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8b8,0x16f,&local_8c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_8f0,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_900,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_904 = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)&mc2.matrix_.colSettings_,2);
    local_908 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_8f0,&local_900,0x16f,1,2,&local_904,"mc1.get_column_dimension(2)",&local_908,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_8f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_918,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_928);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_918,0x170,&local_928);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_950,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_960,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_964 = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)&mc2.matrix_.colSettings_,6);
    local_968 = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_950,&local_960,0x170,1,2,&local_964,"mc1.get_column_dimension(6)",&local_968,
               "2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_950);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_978,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_988);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_978,0x171,&local_988);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_9b0,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_9c4 = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_848);
    local_9c8 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_9b0,&local_9c0,0x171,1,2,&local_9c4,"mc2.get_number_of_columns()",&local_9c8,
               "7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_9b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9d8,0x172,&local_9e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a10,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_a24 = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_848,2);
    local_a28 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a10,&local_a20,0x172,1,2,&local_a24,"mc2.get_column_dimension(2)",&local_a28,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a10);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a38,0x173,&local_a48);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a70,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    mm.matrix_.colSettings_._4_4_ =
         Gudhi::persistence_matrix::
         Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
         ::get_column_dimension
                   ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                     *)local_848,6);
    mm.matrix_.colSettings_._0_4_ = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a70,&local_a80,0x173,1,2,(undefined1 *)((long)&mm.matrix_.colSettings_ + 4),
               "mc2.get_column_dimension(6)",&mm.matrix_.colSettings_,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)local_ba0,
           (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
            *)local_300);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bb0,0x177,&local_bc0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_be8,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bf8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_bfc = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_ba0);
    local_c00 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_be8,&local_bf8,0x177,1,2,&local_bfc,"mm.get_number_of_columns()",&local_c00,
               "7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_be8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c10,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c10,0x178,&local_c20);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c48,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_c5c = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_ba0,2);
    local_c60 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c48,&local_c58,0x178,1,2,&local_c5c,"mm.get_column_dimension(2)",&local_c60,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c70,0x179,&local_c80);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ca8,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cb8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_cbc = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_ba0,6);
    local_cc0 = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ca8,&local_cb8,0x179,1,2,&local_cbc,"mm.get_column_dimension(6)",&local_cc0,
               "2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ca8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cd0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ce0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_cd0,0x17a,&local_ce0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d08,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_d1c = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_300);
    local_d20 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_d08,&local_d18,0x17a,1,2,&local_d1c,"mb.get_number_of_columns()",&local_d20,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d08);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::swap
            ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
              *)local_ba0,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
              *)local_300);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d30,0x17e,&local_d40);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d68,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_d7c = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_ba0);
    local_d80 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_d68,&local_d78,0x17e,1,2,&local_d7c,"mm.get_number_of_columns()",&local_d80,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_da0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d90,0x17f,&local_da0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_dc8,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dd8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_ddc = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_300);
    local_de0 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_dc8,&local_dd8,0x17f,1,2,&local_ddc,"mb.get_number_of_columns()",&local_de0,
               "7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_dc8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_df0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_df0,0x180,&local_e00);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e28,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_e3c = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_300,2);
    local_e40 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e28,&local_e38,0x180,1,2,&local_e3c,"mb.get_column_dimension(2)",&local_e40,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e50,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e50,0x181,&local_e60);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e88,plVar3,(char (*) [1])0x274257);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_e9c = Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
                            *)local_300,6);
    local_ea0 = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e88,&local_e98,0x181,1,2,&local_e9c,"mb.get_column_dimension(6)",&local_ea0,
               "2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
             *)local_ba0);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
             *)local_848);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
             *)&mc2.matrix_.colSettings_);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
             *)local_578);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
             *)local_300);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
             *)local_138);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}